

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode.c
# Opt level: O0

void cvProcessError(CVodeMem cv_mem,int error_code,int line,char *func,char *file,char *msgfmt,...)

{
  char in_AL;
  int iVar1;
  char *__s;
  char *__ptr;
  undefined8 in_RCX;
  undefined4 in_EDX;
  int in_ESI;
  long *in_RDI;
  undefined8 in_R8;
  char *in_R9;
  char *in_XMM0_Qa;
  undefined8 in_XMM0_Qb;
  char *file_and_line;
  char *msg;
  size_t msglen;
  va_list ap;
  undefined1 auStackY_118 [16];
  SUNContext_conflict in_stack_fffffffffffffef8;
  int in_stack_ffffffffffffff04;
  char *in_stack_ffffffffffffff08;
  char *in_stack_ffffffffffffff10;
  char *in_stack_ffffffffffffff18;
  undefined8 in_stack_ffffffffffffff20;
  int line_00;
  undefined4 local_48;
  undefined4 local_44;
  undefined1 *local_40;
  undefined1 *local_38;
  char *local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined4 local_10;
  int local_c;
  long *local_8;
  
  local_38 = auStackY_118;
  line_00 = (int)((ulong)in_stack_ffffffffffffff20 >> 0x20);
  if (in_AL != '\0') {
    in_stack_ffffffffffffff18 = in_XMM0_Qa;
    line_00 = (int)((ulong)in_XMM0_Qb >> 0x20);
  }
  local_40 = &stack0x00000008;
  local_44 = 0x30;
  local_48 = 0x30;
  local_28 = in_R9;
  local_20 = in_R8;
  local_18 = in_RCX;
  local_10 = in_EDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  iVar1 = vsnprintf((char *)0x0,0,in_R9,&local_48);
  __s = (char *)malloc((long)(iVar1 + 1));
  local_40 = &stack0x00000008;
  local_44 = 0x30;
  local_48 = 0x30;
  local_38 = auStackY_118;
  vsnprintf(__s,(long)(iVar1 + 1),local_28,&local_48);
  if (local_8 == (long *)0x0) {
    SUNGlobalFallbackErrHandler(local_10,local_18,local_20,__s,local_c);
  }
  else if (local_c == 99) {
    __ptr = sunCombineFileAndLine(in_stack_ffffffffffffff04,(char *)in_stack_fffffffffffffef8);
    SUNLogger_QueueMsg(*(undefined8 *)(*local_8 + 0x10),2,__ptr,local_18,__s);
    free(__ptr);
  }
  else {
    SUNHandleErrWithMsg(line_00,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                        in_stack_ffffffffffffff08,in_stack_ffffffffffffff04,
                        in_stack_fffffffffffffef8);
    SUNContext_GetLastError(*local_8);
  }
  free(__s);
  return;
}

Assistant:

void cvProcessError(CVodeMem cv_mem, int error_code, int line, const char* func,
                    const char* file, const char* msgfmt, ...)
{
  /* We initialize the argument pointer variable before each vsnprintf call to avoid undefined behavior
     (msgfmt is the last required argument to cvProcessError) */
  va_list ap;

  /* Compose the message */
  va_start(ap, msgfmt);
  size_t msglen = vsnprintf(NULL, 0, msgfmt, ap) + 1;
  va_end(ap);

  char* msg = (char*)malloc(msglen);

  va_start(ap, msgfmt);
  vsnprintf(msg, msglen, msgfmt, ap);
  va_end(ap);

  do {
    if (cv_mem == NULL)
    {
      SUNGlobalFallbackErrHandler(line, func, file, msg, error_code);
      break;
    }

    if (error_code == CV_WARNING)
    {
#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGGING_WARNING
      char* file_and_line = sunCombineFileAndLine(line, file);
      SUNLogger_QueueMsg(CV_LOGGER, SUN_LOGLEVEL_WARNING, file_and_line, func,
                         msg);
      free(file_and_line);
#endif
      break;
    }

    /* Call the SUNDIALS main error handler */
    SUNHandleErrWithMsg(line, func, file, msg, error_code, cv_mem->cv_sunctx);

    /* Clear the error now */
    (void)SUNContext_GetLastError(cv_mem->cv_sunctx);
  }
  while (0);

  free(msg);

  return;
}